

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O3

void slab_cache_check(slab_cache *cache)

{
  undefined1 uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  uint8_t uVar6;
  ulong uVar7;
  size_t sVar8;
  byte bVar9;
  byte bVar10;
  rlist *prVar11;
  rlist *prVar12;
  rlist *prVar13;
  size_t sVar14;
  long lVar15;
  long lVar16;
  byte bVar17;
  slab_list *psVar18;
  
  prVar11 = (cache->allocated).slabs.next;
  bVar5 = true;
  if ((slab_list *)prVar11 == &cache->allocated) {
    lVar15 = 0;
    sVar14 = 0;
    sVar8 = 0;
  }
  else {
    sVar8 = 0;
    sVar14 = 0;
    lVar15 = 0;
    do {
      if (*(int *)&prVar11[2].next != -0x113f0012) {
        bVar5 = false;
        fprintf(_stderr,"%s: incorrect slab magic, expected %d, got %d","slab_cache_check",
                0xeec0ffee);
      }
      bVar9 = *(byte *)((long)&prVar11[2].next + 4);
      bVar10 = cache->order_max;
      prVar12 = prVar11[2].prev;
      if (bVar10 + 1 == (uint)bVar9) {
        lVar15 = (long)&prVar12->prev + lVar15;
        sVar14 = (long)&prVar12->prev + sVar14;
      }
      else {
        if (bVar10 < bVar9) goto LAB_0010420f;
        uVar6 = cache->order0_size_lb;
        prVar13 = (rlist *)(1L << (bVar9 + uVar6 & 0x3f));
        if (prVar12 != prVar13) {
          bVar5 = false;
          fprintf(_stderr,"%s: incorrect slab size, expected %zu, got %zu","slab_cache_check",
                  prVar13);
          bVar10 = cache->order_max;
          uVar6 = cache->order0_size_lb;
        }
        prVar12 = (rlist *)(1L << (uVar6 + bVar10 & 0x3f));
      }
      sVar8 = (long)&prVar12->prev + sVar8;
      prVar11 = prVar11->next;
    } while ((slab_list *)prVar11 != &cache->allocated);
  }
  sVar2 = (cache->allocated).stats.total;
  if (sVar8 != sVar2) {
    bVar5 = false;
    fprintf(_stderr,"%s: incorrect slab statistics, total %zu, factual %zu\n","slab_cache_check",
            sVar2,sVar8);
  }
  bVar9 = cache->order_max;
  bVar10 = 0;
  lVar16 = 0;
  psVar18 = cache->orders;
  do {
    if (bVar9 < bVar10) {
LAB_0010420f:
      __assert_fail("order <= cache->order_max",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/slab_cache.h"
                    ,0xee,"intptr_t slab_order_size(struct slab_cache *, uint8_t)");
    }
    bVar17 = (byte)(1L << (bVar10 + cache->order0_size_lb & 0x3f));
    if (bVar9 < bVar17) goto LAB_0010420f;
    uVar3 = (psVar18->stats).used;
    uVar4 = (psVar18->stats).total;
    uVar7 = uVar3;
    if (((1L << (cache->order0_size_lb + bVar17 & 0x3f)) - 1U & uVar4) != 0) {
      bVar5 = false;
      fprintf(_stderr,
              "%s: incorrect order statistics, the total %zu is not multiple of slab size %zu\n",
              "slab_cache_check",uVar4);
      uVar7 = (psVar18->stats).used;
      bVar9 = cache->order_max;
    }
    if (bVar9 < bVar17) goto LAB_0010420f;
    uVar1 = cache->order0_size_lb;
    if (((1L << (bVar17 + uVar1 & 0x3f)) - 1U & uVar7) != 0) {
      bVar5 = false;
      fprintf(_stderr,
              "%s: incorrect order statistics, the used %zu is not multiple of slab size %zu\n",
              "slab_cache_check",uVar7);
      bVar9 = cache->order_max;
    }
    lVar16 = lVar16 + uVar4;
    sVar14 = sVar14 + uVar3;
    psVar18 = psVar18 + 1;
    bVar10 = bVar10 + 1;
  } while (psVar18 <= cache->orders + bVar9);
  if (lVar15 + lVar16 == sVar8) {
    sVar8 = (cache->allocated).stats.used;
    if (sVar14 == sVar8) {
      if (bVar5) {
        return;
      }
      goto LAB_0010420a;
    }
  }
  else {
    fprintf(_stderr,"%s: incorrect totals, ordered %zu,  huge %zu, total %zu\n","slab_cache_check",
            lVar16);
    sVar8 = (cache->allocated).stats.used;
    if (sVar14 == sVar8) goto LAB_0010420a;
  }
  fprintf(_stderr,"%s: incorrect used total, total %zu, sum %zu\n","slab_cache_check",sVar8,sVar14);
LAB_0010420a:
  abort();
}

Assistant:

void
slab_cache_check(struct slab_cache *cache)
{
	size_t total = 0;
	size_t used = 0;
	size_t ordered = 0;
	size_t huge = 0;
	bool dont_panic = true;

	struct rlist *slabs = &cache->allocated.slabs;
	struct slab *slab;

	rlist_foreach_entry(slab, slabs, next_in_cache) {
		if (slab->magic != slab_magic) {
			fprintf(stderr, "%s: incorrect slab magic,"
				" expected %d, got %d", __func__,
				slab_magic, slab->magic);
			dont_panic = false;
		}
		if (slab->order == cache->order_max + 1) {
			huge += slab->size;
			used += slab->size;
			total += slab->size;
		} else {
			if ((intptr_t) slab->size !=
					slab_order_size(cache, slab->order)) {
				fprintf(stderr, "%s: incorrect slab size,"
					" expected %zu, got %zu", __func__,
					slab_order_size(cache, slab->order),
					slab->size);
				dont_panic = false;
			}
			/*
			 * The slab may have been reformatted
			 * and split into smaller slabs, don't
			 * trust slab->size.
			 */
			total += slab_order_size(cache, cache->order_max);
		}
	}

	if (total != cache->allocated.stats.total) {
		fprintf(stderr, "%s: incorrect slab statistics, total %zu,"
			" factual %zu\n", __func__,
			cache->allocated.stats.total,
			total);
		dont_panic = false;
	}
	struct slab_list *list;
	for (list = cache->orders;
	     list <= cache->orders + cache->order_max;
	     list++) {

		uint8_t order = slab_order_size(cache, list - cache->orders);
		ordered += list->stats.total;
		used += list->stats.used;

		if (list->stats.total % slab_order_size(cache, order)) {
			fprintf(stderr, "%s: incorrect order statistics, the"
				" total %zu is not multiple of slab size %zu\n",
				__func__, list->stats.total,
				slab_order_size(cache, order));
			dont_panic = false;
		}
		if (list->stats.used % slab_order_size(cache, order)) {
			fprintf(stderr, "%s: incorrect order statistics, the"
				" used %zu is not multiple of slab size %zu\n",
				__func__, list->stats.used,
				slab_order_size(cache, order));
			dont_panic = false;
		}
	}

	if (ordered + huge != total) {
		fprintf(stderr, "%s: incorrect totals, ordered %zu, "
			" huge %zu, total %zu\n", __func__,
			ordered, huge, total);
		dont_panic = false;
	}
	if (used != cache->allocated.stats.used) {
		fprintf(stderr, "%s: incorrect used total, "
			"total %zu, sum %zu\n", __func__,
			cache->allocated.stats.used,
			used);
		dont_panic = false;
	}
	if (dont_panic)
		return;
	abort();
}